

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exereader.cpp
# Opt level: O1

BinaryType loader::anon_unknown_0::determine_binary_type(istream *is)

{
  ulong in_RAX;
  char *pcVar1;
  BinaryType BVar2;
  char buffer_1 [2];
  char buffer_2 [2];
  char buffer [2];
  char buffer_3 [2];
  undefined8 local_28;
  
  local_28 = in_RAX;
  pcVar1 = (char *)std::istream::seekg(is,0,0);
  std::istream::read(pcVar1,(long)&local_28 + 4);
  BVar2 = PEMagic2;
  if ((local_28._4_2_ == 0x5a4d) &&
     (BVar2 = PEMagic2, (*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) == 0))
  {
    pcVar1 = (char *)std::istream::seekg(is,0x3c,0);
    std::istream::read(pcVar1,(long)&local_28);
    BVar2 = DOSMagic;
    if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) == 0) {
      pcVar1 = (char *)std::istream::seekg(is,local_28 & 0xffff,0);
      std::istream::read(pcVar1,(long)&local_28 + 2);
      if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) == 0) {
        BVar2 = (BinaryType)local_28._2_2_;
        if (BVar2 == PEMagic) {
          std::istream::read((char *)is,(long)&local_28 + 6);
          if (local_28._6_2_ != 0) {
            return DOSMagic;
          }
          if ((*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) != 0) {
            return DOSMagic;
          }
        }
      }
    }
  }
  return BVar2;
}

Assistant:

BinaryType determine_binary_type(std::istream & is) {
	
	boost::uint16_t dos_magic = util::load<boost::uint16_t>(is.seekg(0));
	if(is.fail() || dos_magic != DOSMagic) {
		return UnknownBinary; // Not a DOS file
	}
	
	// Skip the DOS stub
	boost::uint16_t new_offset = util::load<boost::uint16_t>(is.seekg(0x3c));
	if(is.fail()) {
		return DOSMagic;
	}
	
	boost::uint16_t new_magic = util::load<boost::uint16_t>(is.seekg(new_offset));
	if(is.fail()) {
		return DOSMagic;
	}
	
	if(new_magic == PEMagic) {
		boost::uint16_t pe2_magic = util::load<boost::uint16_t>(is);
		if(is.fail() || pe2_magic != PEMagic2) {
			return DOSMagic;
		}
	}
	
	return BinaryType(new_magic);
}